

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O1

BOOL __thiscall
Js::CustomExternalWrapperObject::DeleteProperty
          (CustomExternalWrapperObject *this,JavascriptString *propertyNameString,
          PropertyOperationFlags flags)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  
  BVar3 = VerifyObjectAlive(this);
  if (BVar3 == 0) {
    iVar4 = 0;
  }
  else {
    local_28 = (PropertyRecord *)0x0;
    bVar2 = JavascriptOperators::ShouldTryDeleteProperty
                      ((RecyclableObject *)this,propertyNameString,&local_28);
    iVar4 = 1;
    if (bVar2) {
      if (local_28 == (PropertyRecord *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                    ,0x460,"(propertyRecord)","propertyRecord");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      iVar4 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x21])
                        (this,(ulong)(uint)local_28->pid,(ulong)flags);
    }
  }
  return iVar4;
}

Assistant:

BOOL CustomExternalWrapperObject::DeleteProperty(Js::JavascriptString *propertyNameString, Js::PropertyOperationFlags flags)
{
    if (!this->VerifyObjectAlive()) return FALSE;
    Js::PropertyRecord const *propertyRecord = nullptr;
    if (Js::JavascriptOperators::ShouldTryDeleteProperty(this, propertyNameString, &propertyRecord))
    {
        Assert(propertyRecord);
        return DeleteProperty(propertyRecord->GetPropertyId(), flags);
    }

    return TRUE;
}